

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O0

void S2::GetChainVertices
               (S2Shape *shape,int chain_id,
               vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  int iVar1;
  uint uVar2;
  int extraout_var;
  bool bVar3;
  undefined1 local_90 [8];
  Edge edge;
  uint local_30;
  int e;
  int num_vertices;
  Chain chain;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices_local;
  int chain_id_local;
  S2Shape *shape_local;
  
  (*shape->_vptr_S2Shape[7])(shape,(ulong)(uint)chain_id);
  iVar1 = (*shape->_vptr_S2Shape[4])();
  uVar2 = extraout_var + (uint)(iVar1 == 1);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::clear(vertices);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            (vertices,(long)(int)uVar2);
  bVar3 = (uVar2 & 1) != 0;
  if (bVar3) {
    (*shape->_vptr_S2Shape[8])(edge.v1.c_ + 2,shape,(ulong)(uint)chain_id);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
              (vertices,(value_type *)(edge.v1.c_ + 2));
  }
  for (local_30 = (uint)bVar3; (int)local_30 < (int)uVar2; local_30 = local_30 + 2) {
    (*shape->_vptr_S2Shape[8])(local_90,shape,(ulong)(uint)chain_id,(ulong)local_30);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
              (vertices,(value_type *)local_90);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
              (vertices,(value_type *)(edge.v0.c_ + 2));
  }
  return;
}

Assistant:

void GetChainVertices(const S2Shape& shape, int chain_id,
                      std::vector<S2Point>* vertices) {
  S2Shape::Chain chain = shape.chain(chain_id);
  int num_vertices = chain.length + (shape.dimension() == 1);
  vertices->clear();
  vertices->reserve(num_vertices);
  int e = 0;
  if (num_vertices & 1) {
    vertices->push_back(shape.chain_edge(chain_id, e++).v0);
  }
  for (; e < num_vertices; e += 2) {
    auto edge = shape.chain_edge(chain_id, e);
    vertices->push_back(edge.v0);
    vertices->push_back(edge.v1);
  }
}